

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O3

int __thiscall Epanet::Project::openOutput(Project *this,char *fname)

{
  char *pcVar1;
  pointer pcVar2;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (this->networkEmpty == false) {
    OutputFile::close(&this->outputFile,(int)fname);
    this->outputFileOpened = false;
    pcVar1 = (char *)(this->outFileName)._M_string_length;
    strlen(fname);
    std::__cxx11::string::_M_replace((ulong)&this->outFileName,0,pcVar1,(ulong)fname);
    if (*fname == '\0') {
      std::__cxx11::string::_M_assign((string *)&this->outFileName);
    }
    pcVar2 = (this->outFileName)._M_dataplus._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar2,pcVar2 + (this->outFileName)._M_string_length);
    OutputFile::open(&this->outputFile,(char *)local_50,(int)this);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    this->outputFileOpened = true;
  }
  return 0;
}

Assistant:

int Project::openOutput(const char* fname)
    {
        //... close an already opened output file
        if ( networkEmpty ) return 0;
        outputFile.close();
        outputFileOpened = false;

        // ... save the name of the output file
        outFileName = fname;
        if ( strlen(fname) == 0 ) outFileName = tmpFileName;

        // ... open the file
        try
        {
            outputFile.open(outFileName, &network);
            outputFileOpened = true;
            return 0;
        }
        catch (ENerror const& e)
        {
            writeMsg(e.msg);
            return e.code;
        }
    }